

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2InitDefaultSAXHandler(xmlSAXHandler *hdlr,int warning)

{
  code *pcVar1;
  
  if ((hdlr != (xmlSAXHandler *)0x0) && (hdlr->initialized == 0)) {
    xmlSAXVersion(hdlr,xmlSAX2DefaultVersionValue);
    if (warning == 0) {
      pcVar1 = (warningSAXFunc)0x0;
    }
    else {
      pcVar1 = xmlParserWarning;
    }
    hdlr->warning = pcVar1;
  }
  return;
}

Assistant:

void
xmlSAX2InitDefaultSAXHandler(xmlSAXHandler *hdlr, int warning)
{
    if ((hdlr == NULL) || (hdlr->initialized != 0))
	return;

    xmlSAXVersion(hdlr, xmlSAX2DefaultVersionValue);
    if (warning == 0)
	hdlr->warning = NULL;
    else
	hdlr->warning = xmlParserWarning;
}